

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FloatBitsToUintIntCase::FloatBitsToUintIntCase
          (FloatBitsToUintIntCase *this,TestContext *testCtx,DataType baseType,Precision precision,
          ShaderType shaderType,bool outIsSigned)

{
  int vecSize;
  DataType basicType;
  char *description;
  undefined3 in_register_00000089;
  allocator<char> local_a5;
  Precision local_a4;
  VarType local_a0;
  string local_88;
  Symbol local_68;
  
  local_a4 = precision;
  shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
            (&local_68.name,(_anonymous_namespace_ *)(ulong)baseType,precision,shaderType,shaderType
            );
  description = "floatBitsToUint";
  if (CONCAT31(in_register_00000089,outIsSigned) != 0) {
    description = "floatBitsToInt";
  }
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,testCtx,local_68.name._M_dataplus._M_p,description,
             shaderType);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_00c0d700;
  vecSize = glu::getDataTypeScalarSize(baseType);
  if (outIsSigned) {
    if (vecSize < 2) {
      basicType = TYPE_INT;
    }
    else {
      basicType = glu::getDataTypeIntVec(vecSize);
    }
  }
  else if (vecSize < 2) {
    basicType = TYPE_UINT;
  }
  else {
    basicType = glu::getDataTypeUintVec(vecSize);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"in0",&local_a5);
  glu::VarType::VarType(&local_a0,baseType,local_a4);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.inputs,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"out0",&local_a5);
  glu::VarType::VarType(&local_a0,basicType,PRECISION_HIGHP);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.outputs,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::assign((char *)&(this->super_CommonFunctionCase).m_spec.source);
  return;
}

Assistant:

FloatBitsToUintIntCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType, bool outIsSigned)
		: CommonFunctionCase	(testCtx, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), outIsSigned ? "floatBitsToInt" : "floatBitsToUint", shaderType)
	{
		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	intType		= outIsSigned ? (vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT)
													  : (vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT);

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(intType, glu::PRECISION_HIGHP)));
		m_spec.source = outIsSigned ? "out0 = floatBitsToInt(in0);" : "out0 = floatBitsToUint(in0);";
	}